

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StreamingConcatenationExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,Type *args,unsigned_long *args_1,uint *args_2,
          span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
          *args_3,SourceRange *args_4)

{
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  streams;
  SourceRange sourceRange;
  StreamingConcatenationExpression *bitstreamWidth;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  undefined8 *in_R8;
  __extent_storage<18446744073709551615UL> in_R9;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  bitstreamWidth =
       (StreamingConcatenationExpression *)
       allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  streams._M_extent._M_extent_value = in_R9._M_extent_value;
  streams._M_ptr = (pointer)in_R8[1];
  sourceRange.endLoc = in_RDX;
  sourceRange.startLoc = in_RCX;
  ast::StreamingConcatenationExpression::StreamingConcatenationExpression
            ((StreamingConcatenationExpression *)*in_R8,*(Type **)(in_R9._M_extent_value + 8),
             *(uint64_t *)in_R9._M_extent_value,(uint64_t)bitstreamWidth,streams,sourceRange);
  return bitstreamWidth;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }